

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Result RVar1;
  Type expected1;
  Opcode local_64;
  Info local_60;
  
  local_64.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_60,&local_64);
  Opcode::GetInfo(&local_60,&local_64);
  if (((limits == (Limits *)0x0) || (local_60.memory_size == 0)) ||
     (expected1.enum_ = I64, limits->is_64 == false)) {
    expected1.enum_ = local_60.param_types[0].enum_;
  }
  Opcode::GetInfo(&local_60,&local_64);
  Opcode::GetInfo(&local_60,&local_64);
  RVar1 = PopAndCheck2Types(this,expected1,local_60.param_types[1],local_60.name);
  Opcode::GetInfo(&local_60,&local_64);
  PushType(this,local_60.result_type);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode, const Limits* limits) {
  Result result =
      PopAndCheck2Types(opcode.GetMemoryParam(opcode.GetParamType1(), limits,
                                              opcode.GetMemorySize() != 0),
                        opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}